

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enoent.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined4 extraout_var;
  int __oflag;
  system_error e;
  allocator<char> local_49;
  string local_48 [32];
  undefined8 local_28;
  file data;
  embedded_filesystem fs;
  
  data._end = (char *)cmrc::enoent::get_filesystem();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"hello.txt",&local_49);
  iVar1 = cmrc::embedded_filesystem::open
                    ((embedded_filesystem *)&data._end,(char *)local_48,__oflag);
  local_28 = CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  return 0;
}

Assistant:

int main() {
    auto fs = cmrc::enoent::get_filesystem();
    try {
        auto data = fs.open("hello.txt");
    } catch (std::system_error e) {
        if (e.code() == std::errc::no_such_file_or_directory) {
            return 1;
        }
    }
    return 0;
}